

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  BYTE *pBVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int *mEnd;
  BYTE *pBVar14;
  int *piVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  U32 UVar20;
  U32 UVar21;
  U32 UVar22;
  ulong uVar23;
  uint uVar24;
  U32 UVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  uint uVar29;
  BYTE *pBVar30;
  int *piVar31;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_b0;
  int *local_a8;
  uint local_9c;
  int local_98;
  uint local_94;
  BYTE *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  BYTE *local_58;
  ulong local_50;
  BYTE *local_48;
  int *local_40;
  U32 *local_38;
  
  pBVar2 = (ms->window).base;
  pBVar30 = (ms->window).dictBase;
  uVar16 = (ms->window).dictLimit;
  local_88 = (ulong)uVar16;
  local_48 = (BYTE *)(ulong)(ms->window).lowLimit;
  uVar13 = (ms->cParams).windowLog;
  local_70 = (int *)CONCAT44(local_70._4_4_,uVar13);
  local_9c = (ms->cParams).minMatch;
  if (5 < local_9c) {
    local_9c = 6;
  }
  if (local_9c < 5) {
    local_9c = 4;
  }
  local_94 = (ms->cParams).searchLog;
  uVar29 = 6;
  if (local_94 < 6) {
    uVar29 = local_94;
  }
  if (uVar29 < 5) {
    uVar29 = 4;
  }
  UVar22 = *rep;
  UVar20 = rep[1];
  ms->lazySkipping = 0;
  local_58 = pBVar2 + local_88;
  local_68 = (int *)((long)src + (srcSize - 0x10));
  uVar19 = ms->nextToUpdate;
  uVar27 = (ulong)uVar19;
  uVar24 = ((int)local_68 - (int)(pBVar2 + uVar27)) + 1;
  uVar8 = 8;
  if (uVar24 < 8) {
    uVar8 = uVar24;
  }
  if (local_68 < pBVar2 + uVar27) {
    uVar8 = 0;
  }
  bVar11 = (byte)uVar29;
  local_90 = pBVar30;
  local_60 = (int *)src;
  local_38 = rep;
  if (uVar19 < uVar8 + uVar19) {
    UVar21 = ms->rowHashLog;
    local_a8 = (int *)srcSize;
    if (0x20 < UVar21 + 8) {
LAB_0017d06e:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar14 = ms->tagTable;
    uVar26 = ms->hashSalt;
    local_80 = (ulong)(0x38 - UVar21);
    local_98 = 0x18 - UVar21;
    local_50 = 0xcf1bbcdcbf9b0000;
    do {
      if (local_9c == 5) {
        uVar23 = *(long *)(pBVar2 + uVar27) * -0x30e4432345000000;
LAB_0017c758:
        uVar23 = (uVar23 ^ uVar26) >> ((byte)(0x38 - UVar21) & 0x3f);
      }
      else {
        if (local_9c == 6) {
          uVar23 = *(long *)(pBVar2 + uVar27) * -0x30e4432340650000;
          goto LAB_0017c758;
        }
        uVar23 = (ulong)((*(int *)(pBVar2 + uVar27) * -0x61c8864f ^ (uint)uVar26) >>
                        ((byte)local_98 & 0x1f));
      }
      uVar24 = ((uint)(uVar23 >> 8) & 0xffffff) << (bVar11 & 0x1f);
      if (((ulong)(pUVar3 + uVar24) & 0x3f) != 0) {
LAB_0017cf57:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar14 + uVar24) & ~(-1L << (bVar11 & 0x3f))) != 0) {
LAB_0017cf76:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar27 & 7] = (U32)uVar23;
      uVar27 = uVar27 + 1;
    } while (uVar8 + uVar19 != uVar27);
  }
  piVar28 = (int *)(srcSize + (long)src);
  piVar31 = (int *)((ulong)(local_58 == (BYTE *)src) + (long)src);
  if (piVar31 < local_68) {
    local_40 = (int *)(pBVar30 + local_88);
    local_48 = local_48 + (long)pBVar30;
    local_80 = CONCAT44(local_80._4_4_,1 << ((byte)uVar13 & 0x1f));
    local_98 = uVar16 - 1;
    local_70 = piVar28 + -8;
    local_50 = ~(-1L << (bVar11 & 0x3f));
    local_a8 = piVar28;
    do {
      iVar12 = ((int)piVar31 - (int)pBVar2) + 1;
      UVar21 = (ms->window).lowLimit;
      UVar25 = iVar12 - (uint)local_80;
      if (iVar12 - UVar21 <= (uint)local_80) {
        UVar25 = UVar21;
      }
      piVar15 = (int *)((long)piVar31 + 1);
      if (ms->loadedDictEnd != 0) {
        UVar25 = UVar21;
      }
      uVar16 = iVar12 - UVar22;
      pBVar14 = pBVar2;
      if (uVar16 < (uint)local_88) {
        pBVar14 = pBVar30;
      }
      bVar7 = true;
      if (((local_98 - uVar16 < 3) || (iVar12 - UVar25 < UVar22)) ||
         (*piVar15 != *(int *)(pBVar14 + uVar16))) {
        uVar27 = 0;
      }
      else {
        mEnd = piVar28;
        if (uVar16 < (uint)local_88) {
          mEnd = local_40;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar31 + 5),(BYTE *)((long)(pBVar14 + uVar16) + 4),
                           (BYTE *)piVar28,(BYTE *)mEnd,local_58);
        uVar27 = sVar9 + 4;
        bVar7 = false;
        piVar28 = local_a8;
        pBVar30 = local_90;
      }
      uVar26 = 1;
      UVar21 = UVar22;
      if (bVar7) {
        local_b0 = 999999999;
        local_78 = uVar27;
        local_60 = (int *)src;
        if (local_9c == 6) {
          if (uVar29 == 6) {
            uVar27 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
          else if (uVar29 == 5) {
            uVar27 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
          else {
            uVar27 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
        }
        else if (local_9c == 5) {
          if (uVar29 == 6) {
            uVar27 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
          else if (uVar29 == 5) {
            uVar27 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
          else {
            uVar27 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0)
            ;
          }
        }
        else if (uVar29 == 6) {
          uVar27 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0);
        }
        else if (uVar29 == 5) {
          uVar27 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0);
        }
        else {
          uVar27 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar31,(BYTE *)piVar28,&local_b0);
        }
        uVar26 = local_b0;
        piVar28 = piVar31;
        if (uVar27 <= local_78) {
          uVar27 = local_78;
          uVar26 = 1;
          piVar28 = piVar15;
        }
        piVar15 = piVar28;
        piVar28 = local_a8;
        pBVar30 = local_90;
        src = local_60;
        if (3 < uVar27) {
          if (3 < uVar26) {
            pcVar17 = (char *)((long)piVar15 + (3 - (long)(pBVar2 + uVar26)));
            pBVar10 = local_58;
            pBVar14 = pBVar2;
            if ((uint)pcVar17 < (uint)local_88) {
              pBVar10 = local_48;
              pBVar14 = local_90;
            }
            if ((local_60 < piVar15) &&
               (uVar23 = (ulong)pcVar17 & 0xffffffff, pBVar10 < pBVar14 + uVar23)) {
              pBVar14 = pBVar14 + uVar23;
              do {
                piVar31 = (int *)((long)piVar15 + -1);
                pBVar14 = pBVar14 + -1;
                if ((*(BYTE *)piVar31 != *pBVar14) ||
                   (uVar27 = uVar27 + 1, piVar15 = piVar31, piVar31 <= local_60)) break;
              } while (pBVar10 < pBVar14);
            }
            UVar21 = (int)uVar26 - 3;
            UVar20 = UVar22;
          }
          goto LAB_0017caa5;
        }
        uVar27 = (long)piVar31 - (long)local_60;
        piVar31 = (int *)((long)piVar31 + (uVar27 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar27);
      }
      else {
LAB_0017caa5:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0017cf95:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0017cfd3:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar23 = (long)piVar15 - (long)src;
        pBVar14 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar14 + uVar23) {
LAB_0017d011:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (piVar28 < piVar15) {
LAB_0017cfb4:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_78 = uVar27;
        if (local_70 < piVar15) {
          ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)piVar15,(BYTE *)local_70);
          piVar28 = local_a8;
          pBVar30 = local_90;
        }
        else {
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar14 = *src;
          *(undefined8 *)(pBVar14 + 8) = uVar6;
          if (0x10 < uVar23) {
            pBVar14 = seqStore->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar23) {
              lVar18 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar18 + 0x20);
                uVar6 = puVar1[1];
                pBVar10 = pBVar14 + lVar18 + 0x20;
                *(undefined8 *)pBVar10 = *puVar1;
                *(undefined8 *)(pBVar10 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar18 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar10 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar10 + 0x18) = uVar6;
                lVar18 = lVar18 + 0x20;
              } while (pBVar10 + 0x20 < pBVar14 + uVar23);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar23;
        if (0xffff < uVar23) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4 = seqStore->sequences;
        psVar4->litLength = (U16)uVar23;
        psVar4->offBase = (U32)uVar26;
        if (local_78 < 3) {
LAB_0017cff2:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_78 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0017d030:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_78 - 3);
        seqStore->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar16 = ms->nextToUpdate;
          uVar27 = (ulong)uVar16;
          uVar13 = ((int)local_68 - (int)(pBVar2 + uVar27)) + 1;
          if (7 < uVar13) {
            uVar13 = 8;
          }
          if (local_68 < pBVar2 + uVar27) {
            uVar13 = 0;
          }
          if (uVar16 < uVar13 + uVar16) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0017d06e;
            pUVar3 = ms->hashTable;
            pBVar30 = ms->tagTable;
            uVar26 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_9c == 5) {
                uVar23 = *(long *)(pBVar2 + uVar27) * -0x30e4432345000000;
LAB_0017cccb:
                uVar23 = (uVar23 ^ uVar26) >> (0x38U - cVar5 & 0x3f);
              }
              else {
                if (local_9c == 6) {
                  uVar23 = *(long *)(pBVar2 + uVar27) * -0x30e4432340650000;
                  goto LAB_0017cccb;
                }
                uVar23 = (ulong)((*(int *)(pBVar2 + uVar27) * -0x61c8864f ^ (uint)uVar26) >>
                                (0x18U - cVar5 & 0x1f));
              }
              uVar19 = ((uint)(uVar23 >> 8) & 0xffffff) << (bVar11 & 0x1f);
              if (((ulong)(pUVar3 + uVar19) & 0x3f) != 0) goto LAB_0017cf57;
              if ((local_50 & (ulong)(pBVar30 + uVar19)) != 0) goto LAB_0017cf76;
              ms->hashCache[(uint)uVar27 & 7] = (U32)uVar23;
              uVar27 = uVar27 + 1;
            } while (uVar13 + uVar16 != uVar27);
          }
          ms->lazySkipping = 0;
          piVar28 = local_a8;
          pBVar30 = local_90;
        }
        src = (void *)((long)piVar15 + local_78);
        piVar31 = (int *)src;
        do {
          UVar22 = UVar21;
          if (local_68 < piVar31) break;
          iVar12 = (int)piVar31 - (int)pBVar2;
          UVar22 = (ms->window).lowLimit;
          UVar25 = iVar12 - (uint)local_80;
          if (iVar12 - UVar22 <= (uint)local_80) {
            UVar25 = UVar22;
          }
          if (ms->loadedDictEnd != 0) {
            UVar25 = UVar22;
          }
          uVar16 = iVar12 - UVar20;
          pBVar14 = pBVar2;
          if (uVar16 < (uint)local_88) {
            pBVar14 = pBVar30;
          }
          if (((local_98 - uVar16 < 3) || (iVar12 - UVar25 < UVar20)) ||
             (*piVar31 != *(int *)(pBVar14 + uVar16))) {
            bVar7 = false;
            UVar22 = UVar20;
          }
          else {
            piVar15 = piVar28;
            if (uVar16 < (uint)local_88) {
              piVar15 = local_40;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar31 + 1),(BYTE *)((long)(pBVar14 + uVar16) + 4),
                               (BYTE *)piVar28,(BYTE *)piVar15,local_58);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0017cf95;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0017cfd3;
            pBVar30 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar30) goto LAB_0017d011;
            if (local_a8 < src) goto LAB_0017cfb4;
            if (local_70 < src) {
              ZSTD_safecopyLiterals(pBVar30,(BYTE *)src,(BYTE *)src,(BYTE *)local_70);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar30 = *src;
              *(undefined8 *)(pBVar30 + 8) = uVar6;
            }
            psVar4 = seqStore->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_0017cff2;
            if (0xffff < sVar9 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0017d030;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar9 + 1);
            seqStore->sequences = psVar4 + 1;
            src = (void *)((long)piVar31 + sVar9 + 4);
            bVar7 = true;
            piVar28 = local_a8;
            pBVar30 = local_90;
            piVar31 = (int *)src;
            UVar22 = UVar21;
            UVar21 = UVar20;
          }
          UVar20 = UVar22;
          UVar22 = UVar21;
        } while (bVar7);
      }
    } while (piVar31 < local_68);
  }
  *local_38 = UVar22;
  local_38[1] = UVar20;
  return (long)piVar28 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}